

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

int __thiscall
leveldb::MemTable::KeyComparator::operator()(KeyComparator *this,char *aptr,char *bptr)

{
  long lVar1;
  int iVar2;
  InternalKeyComparator *this_00;
  char *in_RDX;
  long in_FS_OFFSET;
  Slice SVar3;
  Slice b;
  Slice a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar3 = GetLengthPrefixedSlice(in_RDX);
  this_00 = (InternalKeyComparator *)SVar3.data_;
  SVar3 = GetLengthPrefixedSlice(in_RDX);
  iVar2 = InternalKeyComparator::Compare(this_00,(Slice *)SVar3.size_,(Slice *)SVar3.data_);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int MemTable::KeyComparator::operator()(const char* aptr,
                                        const char* bptr) const {
  // Internal keys are encoded as length-prefixed strings.
  Slice a = GetLengthPrefixedSlice(aptr);
  Slice b = GetLengthPrefixedSlice(bptr);
  return comparator.Compare(a, b);
}